

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O3

CURLcode Curl_resolver_wait_resolv(connectdata *conn,Curl_dns_entry **entry)

{
  _Bool _Var1;
  void *pvVar2;
  int iVar3;
  CURLcode CVar4;
  Curl_dns_entry *pCVar5;
  char *pcVar6;
  
  iVar3 = Curl_thread_join((pthread_t **)(conn->async).os_specific);
  if ((entry == (Curl_dns_entry **)0x0) || (iVar3 == 0)) {
    CVar4 = CURLE_OK;
    (conn->async).done = true;
    if (entry == (Curl_dns_entry **)0x0) {
      pCVar5 = (conn->async).dns;
      CVar4 = CURLE_OK;
      goto LAB_001380d7;
    }
  }
  else {
    pvVar2 = (conn->async).os_specific;
    CVar4 = Curl_addrinfo_callback
                      (conn,*(int *)((long)pvVar2 + 0x34),*(Curl_addrinfo **)((long)pvVar2 + 0x38));
    *(undefined8 *)((long)pvVar2 + 0x38) = 0;
    (conn->async).done = true;
  }
  pCVar5 = (conn->async).dns;
  *entry = pCVar5;
LAB_001380d7:
  if (pCVar5 == (Curl_dns_entry *)0x0) {
    _Var1 = (conn->bits).httpproxy;
    pcVar6 = "host";
    if (_Var1 != false) {
      pcVar6 = "proxy";
    }
    CVar4 = CURLE_COULDNT_RESOLVE_HOST - _Var1;
    Curl_failf(conn->data,"Could not resolve %s: %s",pcVar6,(conn->async).hostname);
  }
  destroy_async_data(&conn->async);
  if ((conn->async).dns == (Curl_dns_entry *)0x0) {
    Curl_conncontrol(conn,1);
  }
  return CVar4;
}

Assistant:

CURLcode Curl_resolver_wait_resolv(struct connectdata *conn,
                                   struct Curl_dns_entry **entry)
{
  struct thread_data   *td = (struct thread_data*) conn->async.os_specific;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(conn && td);
  DEBUGASSERT(td->thread_hnd != curl_thread_t_null);

  /* wait for the thread to resolve the name */
  if(Curl_thread_join(&td->thread_hnd)) {
    if(entry)
      result = getaddrinfo_complete(conn);
  }
  else
    DEBUGASSERT(0);

  conn->async.done = TRUE;

  if(entry)
    *entry = conn->async.dns;

  if(!conn->async.dns)
    /* a name was not resolved, report error */
    result = resolver_error(conn);

  destroy_async_data(&conn->async);

  if(!conn->async.dns)
    connclose(conn, "asynch resolve failed");

  return result;
}